

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::LossLayer::ByteSizeLong(LossLayer *this)

{
  size_type sVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  
  sVar1 = ((this->name_).ptr_)->_M_string_length;
  if (sVar1 == 0) {
    sVar5 = 0;
  }
  else {
    uVar4 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar1 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->_oneof_case_[0] == 0xb) {
    sVar3 = MeanSquaredErrorLossLayer::ByteSizeLong
                      ((this->LossLayerType_).meansquarederrorlosslayer_);
  }
  else {
    if (this->_oneof_case_[0] != 10) goto LAB_004af996;
    sVar3 = CategoricalCrossEntropyLossLayer::ByteSizeLong
                      ((this->LossLayerType_).categoricalcrossentropylosslayer_);
  }
  uVar4 = (uint)sVar3 | 1;
  iVar2 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar5 = sVar5 + sVar3 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
LAB_004af996:
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t LossLayer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LossLayer)
  size_t total_size = 0;

  // string name = 1;
  if (this->name().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->name());
  }

  switch (LossLayerType_case()) {
    // .CoreML.Specification.CategoricalCrossEntropyLossLayer categoricalCrossEntropyLossLayer = 10;
    case kCategoricalCrossEntropyLossLayer: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *LossLayerType_.categoricalcrossentropylosslayer_);
      break;
    }
    // .CoreML.Specification.MeanSquaredErrorLossLayer meanSquaredErrorLossLayer = 11;
    case kMeanSquaredErrorLossLayer: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *LossLayerType_.meansquarederrorlosslayer_);
      break;
    }
    case LOSSLAYERTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}